

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FM.cpp
# Opt level: O1

void __thiscall
GainContainer::GainContainer
          (GainContainer *this,Hypergraph *hypergraph,Partitionment *partitionment)

{
  vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_> *this_00;
  pointer *ppaVar1;
  pointer *ppCVar2;
  int *piVar3;
  pointer pvVar4;
  uint *puVar5;
  long lVar6;
  iterator __position;
  pointer paVar7;
  iterator __position_00;
  undefined4 uVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *cell;
  pointer pvVar9;
  uint *puVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  difference_type __n;
  ulong uVar14;
  int iVar15;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *net;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range1;
  CellsInPartitions num_cells;
  uint max_gain;
  CellState local_48;
  uint local_34;
  
  (this->num_cells_in_partitions_).
  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->num_cells_in_partitions_).
  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buckets_).super__Vector_base<GainBuckets,_std::allocator<GainBuckets>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buckets_).super__Vector_base<GainBuckets,_std::allocator<GainBuckets>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cell_states_).
  super__Vector_base<GainContainer::CellState,_std::allocator<GainContainer::CellState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->buckets_).super__Vector_base<GainBuckets,_std::allocator<GainBuckets>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cell_states_).
  super__Vector_base<GainContainer::CellState,_std::allocator<GainContainer::CellState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cell_states_).
  super__Vector_base<GainContainer::CellState,_std::allocator<GainContainer::CellState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->num_cells_in_partitions_).
  super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar9 = (hypergraph->cells_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = (hypergraph->cells_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar9 == pvVar4) {
    local_34 = 0;
  }
  else {
    local_34 = 0;
    do {
      uVar12 = (uint)((ulong)((long)(pvVar9->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pvVar9->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_start) >> 2);
      if (uVar12 < local_34) {
        uVar12 = local_34;
      }
      local_34 = uVar12;
      pvVar9 = pvVar9 + 1;
    } while (pvVar9 != pvVar4);
  }
  this_00 = &this->num_cells_in_partitions_;
  iVar13 = 1;
  do {
    std::vector<GainBuckets,std::allocator<GainBuckets>>::emplace_back<unsigned_int&>
              ((vector<GainBuckets,std::allocator<GainBuckets>> *)&this->buckets_,&local_34);
    iVar13 = iVar13 + -1;
  } while (iVar13 == 0);
  std::vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>::
  reserve(this_00,((long)(hypergraph->nets_).
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(hypergraph->nets_).
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  pvVar4 = (hypergraph->nets_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar9 = (hypergraph->nets_).
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pvVar9 != pvVar4; pvVar9 = pvVar9 + 1) {
    local_48.iter._M_node = (_List_node_base *)0x0;
    puVar10 = (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    puVar5 = (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar10 != puVar5) {
      lVar6 = (long)(partitionment->partitionment_).super__Bvector_base<std::allocator<bool>_>.
                    _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      do {
        piVar3 = (int *)((long)&local_48.iter._M_node +
                        (ulong)((*(ulong *)(lVar6 + (ulong)(*puVar10 >> 6) * 8) >>
                                 ((ulong)*puVar10 & 0x3f) & 1) != 0) * 4);
        *piVar3 = *piVar3 + 1;
        puVar10 = puVar10 + 1;
      } while (puVar10 != puVar5);
    }
    __position._M_current =
         (this->num_cells_in_partitions_).
         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->num_cells_in_partitions_).
        super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::array<unsigned_int,2ul>,std::allocator<std::array<unsigned_int,2ul>>>::
      _M_realloc_insert<std::array<unsigned_int,2ul>const&>
                ((vector<std::array<unsigned_int,2ul>,std::allocator<std::array<unsigned_int,2ul>>>
                  *)this_00,__position,(array<unsigned_int,_2UL> *)&local_48);
    }
    else {
      *(_List_node_base **)(__position._M_current)->_M_elems = local_48.iter._M_node;
      ppaVar1 = &(this->num_cells_in_partitions_).
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
  }
  std::vector<GainContainer::CellState,_std::allocator<GainContainer::CellState>_>::reserve
            (&this->cell_states_,
             ((long)(hypergraph->cells_).
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(hypergraph->cells_).
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  pvVar9 = (hypergraph->cells_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((hypergraph->cells_).
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar9) {
    uVar14 = 0;
    do {
      uVar11 = 1L << ((byte)uVar14 & 0x3f) &
               *(ulong *)((long)(partitionment->partitionment_).
                                super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                         (uVar14 >> 6) * 8);
      puVar10 = pvVar9[uVar14].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar5 = pvVar9[uVar14].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      iVar13 = 0;
      if (puVar10 != puVar5) {
        paVar7 = (this_00->
                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        iVar13 = 0;
        do {
          iVar15 = 1;
          if (paVar7[*puVar10]._M_elems[uVar11 != 0] != 1) {
            iVar15 = -(uint)(paVar7[*puVar10]._M_elems[uVar11 == 0] == 0);
          }
          iVar13 = iVar13 + iVar15;
          puVar10 = puVar10 + 1;
        } while (puVar10 != puVar5);
      }
      local_48.iter =
           GainBuckets::addCell
                     ((GainBuckets *)
                      ((long)&(((this->buckets_).
                                super__Vector_base<GainBuckets,_std::allocator<GainBuckets>_>.
                                _M_impl.super__Vector_impl_data._M_start)->container_).
                              super__Vector_base<std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      + (ulong)((uint)(uVar11 != 0) * 0x28)),iVar13,(uint)uVar14);
      uVar8 = local_48._12_4_;
      local_48._12_4_ = local_48._12_4_ & 0xffffff00;
      __position_00._M_current =
           (this->cell_states_).
           super__Vector_base<GainContainer::CellState,_std::allocator<GainContainer::CellState>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_48.gain = iVar13;
      if (__position_00._M_current ==
          (this->cell_states_).
          super__Vector_base<GainContainer::CellState,_std::allocator<GainContainer::CellState>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<GainContainer::CellState,_std::allocator<GainContainer::CellState>_>::
        _M_realloc_insert<GainContainer::CellState>(&this->cell_states_,__position_00,&local_48);
      }
      else {
        uVar11 = CONCAT44(uVar8,iVar13) & 0xffffff00ffffffff;
        ((__position_00._M_current)->iter)._M_node = local_48.iter._M_node;
        (__position_00._M_current)->gain = (int)uVar11;
        (__position_00._M_current)->locked = (bool)(char)(uVar11 >> 0x20);
        *(int3 *)&(__position_00._M_current)->field_0xd = (int3)(uVar11 >> 0x28);
        ppCVar2 = &(this->cell_states_).
                   super__Vector_base<GainContainer::CellState,_std::allocator<GainContainer::CellState>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppCVar2 = *ppCVar2 + 1;
      }
      uVar14 = (ulong)((uint)uVar14 + 1);
      pvVar9 = (hypergraph->cells_).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar11 = ((long)(hypergraph->cells_).
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar9 >> 3) *
               -0x5555555555555555;
    } while (uVar14 <= uVar11 && uVar11 - uVar14 != 0);
  }
  return;
}

Assistant:

GainContainer::GainContainer(const Hypergraph &hypergraph, const Partitionment &partitionment) {
  // create PartitionGains for both parts
  auto max_gain = hypergraph.getMaxAdjacency();
  for (unsigned i = 0; i < 2; ++i)
    buckets_.emplace_back(max_gain);
  // calculate number of cells in each partition for all nets
  num_cells_in_partitions_.reserve(hypergraph.getNets().size());
  for (const auto &net : hypergraph.getNets()) {
    CellsInPartitions num_cells{0, 0};
    for (unsigned cell : net)
      ++num_cells[partitionment[cell]];
    num_cells_in_partitions_.push_back(num_cells);
  }
  // calculate gains for all cells
  cell_states_.reserve(hypergraph.getCells().size());
  for (unsigned cell = 0; cell < hypergraph.getCells().size(); ++cell) {
    auto cell_part = partitionment[cell];
    int gain = 0;
    for (unsigned net : hypergraph.getCells()[cell])
      if (num_cells_in_partitions_[net][cell_part] == 1)
        ++gain;
      else if (num_cells_in_partitions_[net][OppositePart(cell_part)] == 0)
        --gain;
    cell_states_.push_back(CellState{buckets_[cell_part].addCell(gain, cell), gain, false});
  }
}